

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::StaticInit::StaticInit(StaticInit *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  source_loc loc;
  source_loc loc_00;
  bool bVar2;
  int iVar3;
  logger *plVar4;
  ResourceBase *pRVar5;
  undefined4 extraout_var;
  DebugScreen *pDVar6;
  undefined4 extraout_var_00;
  uint tileWidth;
  uint tileWidth_00;
  string_view_t fmt;
  string_view_t fmt_00;
  string local_88;
  path local_60;
  path local_40;
  
  plVar4 = spdlog::default_logger_raw();
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  spdlog::logger::log(plVar4,0.0);
  pRVar5 = Locator::getResource();
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"resources/texturePackGrid.png","");
  local_40._path._M_dataplus._M_p = (pointer)&local_40._path.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_40,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  ghc::filesystem::path::postprocess_path_with_format(&local_40,auto_format);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"resources/texturePackNoGrid.png","");
  local_60._path._M_dataplus._M_p = (pointer)&local_60._path.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_60,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  ghc::filesystem::path::postprocess_path_with_format(&local_60,auto_format);
  iVar3 = (*pRVar5->_vptr_ResourceBase[2])(pRVar5,&local_40,1);
  this->tilesetGrid = (Texture *)CONCAT44(extraout_var,iVar3);
  anon_unknown.dwarf_a87c1::loadTileset(&local_40,(Texture *)CONCAT44(extraout_var,iVar3),tileWidth)
  ;
  sf::Texture::setSmooth(this->tilesetGrid,true);
  bVar2 = sf::Texture::generateMipmap(this->tilesetGrid);
  if (!bVar2) {
    plVar4 = spdlog::default_logger_raw();
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x2c;
    fmt.data_ = "\"{}\": Unable to generate mipmap for texture.";
    spdlog::logger::log_<ghc::filesystem::path_const&>(plVar4,loc,warn,fmt,&local_40);
  }
  pDVar6 = DebugScreen::instance();
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"tilesetGrid","");
  DebugScreen::registerTexture(pDVar6,&local_88,this->tilesetGrid);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  iVar3 = (*pRVar5->_vptr_ResourceBase[2])(pRVar5,&local_60,1);
  this->tilesetNoGrid = (Texture *)CONCAT44(extraout_var_00,iVar3);
  anon_unknown.dwarf_a87c1::loadTileset
            (&local_60,(Texture *)CONCAT44(extraout_var_00,iVar3),tileWidth_00);
  sf::Texture::setSmooth(this->tilesetNoGrid,true);
  bVar2 = sf::Texture::generateMipmap(this->tilesetNoGrid);
  if (!bVar2) {
    plVar4 = spdlog::default_logger_raw();
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    loc_00.funcname = (char *)0x0;
    loc_00.filename = (char *)0x0;
    loc_00.line = 0;
    loc_00._12_4_ = 0;
    fmt_00.size_ = 0x2c;
    fmt_00.data_ = "\"{}\": Unable to generate mipmap for texture.";
    spdlog::logger::log_<ghc::filesystem::path_const&>(plVar4,loc_00,warn,fmt_00,&local_60);
  }
  pDVar6 = DebugScreen::instance();
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"tilesetNoGrid","");
  DebugScreen::registerTexture(pDVar6,&local_88,this->tilesetNoGrid);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  ghc::filesystem::path::~path(&local_60);
  ghc::filesystem::path::~path(&local_40);
  return;
}

Assistant:

Board::StaticInit::StaticInit() {
    spdlog::debug("Board::StaticInit initializing.");
    ResourceBase* resource = Locator::getResource();
    const fs::path& filenameGrid = "resources/texturePackGrid.png";
    const fs::path& filenameNoGrid = "resources/texturePackNoGrid.png";

    tilesetGrid = &resource->getTexture(filenameGrid, true);
    loadTileset(filenameGrid, tilesetGrid, TileWidth::TEXELS);
    tilesetGrid->setSmooth(true);
    if (!tilesetGrid->generateMipmap()) {
        spdlog::warn("\"{}\": Unable to generate mipmap for texture.", filenameGrid);
    }
    DebugScreen::instance()->registerTexture("tilesetGrid", tilesetGrid);

    tilesetNoGrid = &resource->getTexture(filenameNoGrid, true);
    loadTileset(filenameNoGrid, tilesetNoGrid, TileWidth::TEXELS);
    tilesetNoGrid->setSmooth(true);
    if (!tilesetNoGrid->generateMipmap()) {
        spdlog::warn("\"{}\": Unable to generate mipmap for texture.", filenameNoGrid);
    }
    DebugScreen::instance()->registerTexture("tilesetNoGrid", tilesetNoGrid);
}